

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

Dec_Graph_t * Abc_NodeMffcSingleNode(Abc_ManRst_t *p,Vec_Int_t *vSims,int nNodes,Vec_Int_t *vOnes)

{
  uint uVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t eEdge1;
  int iVar3;
  Dec_Graph_t *pGraph_00;
  void *pvVar4;
  Dec_Node_t *pDVar5;
  int local_50;
  int local_4c;
  int k;
  int i;
  uint uRoot;
  Dec_Edge_t eRoot;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  Dec_Graph_t *pGraph;
  Vec_Int_t *vOnes_local;
  int nNodes_local;
  Vec_Int_t *vSims_local;
  Abc_ManRst_t *p_local;
  
  uVar1 = Vec_IntEntryLast(vSims);
  local_4c = 0;
  do {
    local_50 = local_4c;
    if (vOnes->nSize <= local_4c) {
      return (Dec_Graph_t *)0x0;
    }
    while (local_50 = local_50 + 1, local_50 < vOnes->nSize) {
      if ((uVar1 ^ 0xffffffff) == (vOnes->pArray[local_4c] | vOnes->pArray[local_50])) {
        DVar2 = Dec_IntToEdge(vOnes->pArray[local_4c] ^ 1);
        eEdge1 = Dec_IntToEdge(vOnes->pArray[local_50] ^ 1);
        pGraph_00 = Dec_GraphCreate(2);
        pvVar4 = Vec_PtrEntry(p->vDecs,(uint)DVar2 >> 1 & 0x3fffffff);
        pDVar5 = Dec_GraphNode(pGraph_00,0);
        (pDVar5->field_2).pFunc = pvVar4;
        pvVar4 = Vec_PtrEntry(p->vDecs,(uint)eEdge1 >> 1 & 0x3fffffff);
        pDVar5 = Dec_GraphNode(pGraph_00,1);
        (pDVar5->field_2).pFunc = pvVar4;
        DVar2 = Dec_GraphAddNodeAnd(pGraph_00,DVar2,eEdge1);
        Dec_GraphSetRoot(pGraph_00,DVar2);
        iVar3 = Abc_NodeCheckFull(p,pGraph_00);
        if (iVar3 != 0) {
          return pGraph_00;
        }
        Dec_GraphFree(pGraph_00);
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Abc_NodeMffcSingleNode( Abc_ManRst_t * p, Vec_Int_t * vSims, int nNodes, Vec_Int_t * vOnes )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eNode0, eNode1, eRoot;
    unsigned uRoot;
    int i, k;
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    for ( i = 0; i < vOnes->nSize; i++ )
        for ( k = i+1; k < vOnes->nSize; k++ )
            if ( ~uRoot == ((unsigned)vOnes->pArray[i] | (unsigned)vOnes->pArray[k]) )
            {
                eNode0 = Dec_IntToEdge( vOnes->pArray[i] ^ 1 );
                eNode1 = Dec_IntToEdge( vOnes->pArray[k] ^ 1 );
                pGraph = Dec_GraphCreate( 2 );
                Dec_GraphNode( pGraph, 0 )->pFunc = Vec_PtrEntry( p->vDecs, eNode0.Node );
                Dec_GraphNode( pGraph, 1 )->pFunc = Vec_PtrEntry( p->vDecs, eNode1.Node );
                eRoot = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
                Dec_GraphSetRoot( pGraph, eRoot );
                if ( Abc_NodeCheckFull( p, pGraph ) )
                    return pGraph;
                Dec_GraphFree( pGraph );
            }
    return NULL;
}